

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.h
# Opt level: O2

void StartGame(void)

{
  int iVar1;
  string key;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  selectionLevel[0] = false;
  selectionLevel[1] = false;
  selectionLevel[2] = false;
  selectionLevel[3] = false;
  local_90 = local_80;
  local_88 = 0;
  selectionLevel[4] = false;
  local_80[0] = 0;
  do {
    while (Points < 0x191) {
      std::operator<<((ostream *)&std::cout,anon_var_dwarf_1d5a);
      SelectLevel();
      TimeChoose();
      Flag = 1;
      while ((Flag != 0 && (Points < 0x191))) {
        SetTask();
      }
    }
    levelFive_abi_cxx11_[99].field_2._M_local_buf[(long)Token + 0xf] = '\x01';
    PrintGameMenu();
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_1d64);
    std::operator>>((istream *)&std::cin,(string *)&local_90);
    std::__cxx11::string::string((string *)&local_50,(string *)&local_90);
    InputCheck(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,(string *)&local_90);
    iVar1 = InputCheck(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (iVar1 == 99) {
      std::operator<<((ostream *)&std::cout,"GAME OVER\n");
    }
    Points = 0;
  } while( true );
}

Assistant:

void StartGame()
{
    selectionLevel[0] = false;
    selectionLevel[1] = false;
    selectionLevel[2] = false;
    selectionLevel[3] = false;
    selectionLevel[4] = false;
    string key;



    while (1) {
        while (Points <= 400) {
            cout << "Выбор уровня 1 - 5";
            SelectLevel();

            TimeChoose();
            Flag = 1;
            while ((Flag != 0) && (Points <= 400)) {
                SetTask();
            }
        }
        selectionLevel[Token - 1] = true;

        PrintGameMenu();
        cout << "Продолжишь или нет?Если да то введи любую кнопку ,если нет "
                "введи "
                "99\n";
        cin >> key;
        InputCheck(key);
        if(InputCheck(key)==99) {
            cout << "GAME OVER\n";
        }
        Points = 0;
    }

}